

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

void Abc_AigRehash(Abc_Aig_t *pMan)

{
  Abc_Obj_t *pAVar1;
  int *piVar2;
  void **ppvVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  Abc_Obj_t *pAVar7;
  uint uVar8;
  uint uVar9;
  Abc_Obj_t **ppAVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  
  uVar16 = (ulong)pMan->nBins;
  ppAVar10 = (Abc_Obj_t **)calloc(1,uVar16 * 8);
  if ((long)uVar16 < 1) {
    iVar15 = 0;
  }
  else {
    lVar12 = 0;
    iVar15 = 0;
    do {
      pAVar7 = pMan->pBins[lVar12];
      while (pAVar7 != (Abc_Obj_t *)0x0) {
        pAVar1 = pAVar7->pNext;
        piVar2 = (pAVar7->vFanins).pArray;
        iVar14 = *piVar2;
        iVar13 = piVar2[1];
        if (iVar13 < iVar14) {
          *piVar2 = iVar13;
          piVar2[1] = iVar14;
          uVar8 = *(uint *)&pAVar7->field_0x14;
          uVar8 = (uVar8 & 0xfffff3ff | uVar8 >> 1 & 0x400) + (uVar8 & 0x400) * 2;
          *(uint *)&pAVar7->field_0x14 = uVar8;
          iVar14 = *piVar2;
          iVar13 = piVar2[1];
          uVar16 = (ulong)(uint)pMan->nBins;
        }
        else {
          uVar8 = *(uint *)&pAVar7->field_0x14;
        }
        ppvVar3 = pAVar7->pNtk->vObjs->pArray;
        pvVar4 = ppvVar3[iVar14];
        pvVar5 = ppvVar3[iVar13];
        uVar11 = 0;
        if ((((uint)pvVar4 ^ uVar8 >> 10) & 1) != 0) {
          uVar11 = 0x38f;
        }
        uVar9 = 0;
        if (((uVar8 >> 0xb ^ (uint)pvVar5) & 1) != 0) {
          uVar9 = 0x161;
        }
        uVar6 = (ulong)(uVar9 ^ uVar11 ^
                        *(int *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x10) * 0x1f01 ^
                       *(int *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 0x10) * 0xb9b) %
                (uVar16 & 0xffffffff);
        pAVar7->pNext = ppAVar10[uVar6];
        ppAVar10[uVar6] = pAVar7;
        iVar15 = iVar15 + 1;
        pAVar7 = pAVar1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar16);
  }
  if (iVar15 == pMan->nEntries) {
    if (pMan->pBins != (Abc_Obj_t **)0x0) {
      free(pMan->pBins);
    }
    pMan->pBins = ppAVar10;
    return;
  }
  __assert_fail("Counter == pMan->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                ,0x295,"void Abc_AigRehash(Abc_Aig_t *)");
}

Assistant:

void Abc_AigRehash( Abc_Aig_t * pMan )
{
    Abc_Obj_t ** pBinsNew;
    Abc_Obj_t * pEnt, * pEnt2;
    int * pArray;
    unsigned Key;
    int Counter, Temp, i;

    // allocate a new array
    pBinsNew = ABC_ALLOC( Abc_Obj_t *, pMan->nBins );
    memset( pBinsNew, 0, sizeof(Abc_Obj_t *) * pMan->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntrySafe( pMan->pBins[i], pEnt, pEnt2 )
        {
            // swap the fanins if needed
            pArray = pEnt->vFanins.pArray;
            if ( pArray[0] > pArray[1] )
            {
                Temp = pArray[0];
                pArray[0] = pArray[1];
                pArray[1] = Temp;
                Temp = pEnt->fCompl0;
                pEnt->fCompl0 = pEnt->fCompl1;
                pEnt->fCompl1 = Temp;
            }
            // rehash the node
            Key = Abc_HashKey2( Abc_ObjChild0(pEnt), Abc_ObjChild1(pEnt), pMan->nBins );
            pEnt->pNext   = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == pMan->nEntries );
    // replace the table and the parameters
    ABC_FREE( pMan->pBins );
    pMan->pBins = pBinsNew;
}